

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseProperties
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          *props,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames)

{
  bool bVar1;
  ostream *poVar2;
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream ss_e;
  undefined1 local_50 [8];
  string tok;
  uint64_t loc;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *props_local;
  AsciiParser *this_local;
  
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    tok.field_2._8_8_ = CurrLoc(this);
    ::std::__cxx11::string::string((string *)local_50);
    bVar1 = ReadIdentifier(this,(string *)local_50);
    if (bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"rel");
      if (bVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar2 = ::std::operator<<((ostream *)local_1d0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseProperties");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x11d9);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_1d0,"TODO: Parse rel");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        this_local._7_1_ = 0;
        bVar1 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_1d0);
      }
      else {
        SeekTo(this,tok.field_2._8_8_);
        bVar1 = false;
      }
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    ::std::__cxx11::string::~string((string *)local_50);
    if (!bVar1) {
      this_local._7_1_ = ParsePrimProps(this,props,propNames);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseProperties(std::map<std::string, Property> *props,
                                  std::vector<value::token> *propNames) {
  // property : primm_attr
  //          | 'rel' name '=' path
  //          ;

  if (!SkipWhitespace()) {
    return false;
  }

  // rel?
  {
    uint64_t loc = CurrLoc();
    std::string tok;

    if (!ReadIdentifier(&tok)) {
      return false;
    }

    if (tok == "rel") {
      PUSH_ERROR_AND_RETURN("TODO: Parse rel");
    } else {
      SeekTo(loc);
    }
  }

  // attribute
  return ParsePrimProps(props, propNames);
}